

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenVertexNormalsProcess.cpp
# Opt level: O2

void __thiscall
Assimp::GenVertexNormalsProcess::Execute(GenVertexNormalsProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  DeadlyImportError *this_00;
  byte bVar3;
  uint a;
  ulong uVar4;
  allocator<char> local_49;
  string local_48;
  
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"GenVertexNormalsProcess begin");
  if ((pScene->mFlags & 8) != 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here"
               ,&local_49);
    DeadlyImportError::DeadlyImportError(this_00,&local_48);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar3 = 0;
  for (uVar4 = 0; uVar4 < pScene->mNumMeshes; uVar4 = uVar4 + 1) {
    bVar1 = GenMeshVertexNormals(this,pScene->mMeshes[uVar4],(uint)uVar4);
    bVar3 = bVar3 | bVar1;
  }
  pLVar2 = DefaultLogger::get();
  if (bVar3 != 0) {
    Logger::info(pLVar2,"GenVertexNormalsProcess finished. Vertex normals have been calculated");
    return;
  }
  Logger::debug(pLVar2,"GenVertexNormalsProcess finished. Normals are already there");
  return;
}

Assistant:

void GenVertexNormalsProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("GenVertexNormalsProcess begin");

    if (pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) {
        throw DeadlyImportError("Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here");
    }

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a) {
        if(GenMeshVertexNormals( pScene->mMeshes[a],a))
            bHas = true;
    }

    if (bHas)   {
        ASSIMP_LOG_INFO("GenVertexNormalsProcess finished. "
            "Vertex normals have been calculated");
    } else {
        ASSIMP_LOG_DEBUG("GenVertexNormalsProcess finished. "
            "Normals are already there");
    }
}